

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

QIcon __thiscall QComboBoxPrivate::itemIcon(QComboBoxPrivate *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  QVariant *in_RDX;
  long in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QVariant decoration;
  QModelIndex *pQVar3;
  QPixmap local_40 [24];
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  bVar1 = QModelIndex::isValid(in_RDI);
  if (bVar1) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(**(long **)(in_RSI + 0x298) + 0x90))(&local_28,*(long **)(in_RSI + 0x298),in_RDX,1)
    ;
    iVar2 = ::QVariant::userType((QVariant *)0x536b15);
    if (iVar2 == 0x1001) {
      qvariant_cast<QPixmap>(in_RDX);
      QIcon::QIcon((QIcon *)in_RDI,(QPixmap *)local_40);
      QPixmap::~QPixmap(local_40);
    }
    else {
      qvariant_cast<QIcon>(in_RDX);
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  else {
    QIcon::QIcon((QIcon *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)(QIconPrivate *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QComboBoxPrivate::itemIcon(const QModelIndex &index) const
{
    if (!index.isValid())
        return {};
    QVariant decoration = model->data(index, Qt::DecorationRole);
    if (decoration.userType() == QMetaType::QPixmap)
        return QIcon(qvariant_cast<QPixmap>(decoration));
    else
        return qvariant_cast<QIcon>(decoration);
}